

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O3

string * AfterburnerUtil::trim(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + str->_M_string_length);
  uVar3 = str->_M_string_length;
  lVar5 = 0;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar5] = cVar1;
        lVar5 = lVar5 + 1;
        uVar3 = str->_M_string_length;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string str) {
    // Convert all character in string to lower case
    std::string tmp = str;
    long number_of_char = 0;
    for (size_t ii = 0; ii < str.size(); ii++) {
        if (str[ii] != ' ' && str[ii] != '\t') {
            tmp[number_of_char] = str[ii];
            number_of_char++;
        }
    }
    tmp.resize(number_of_char);
    return tmp;
}